

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_RegressionGitHubIssue4_Test::TestBody
          (StatePointer_RegressionGitHubIssue4_Test *this)

{
  bool bVar1;
  reference_type piVar2;
  char *message;
  AssertHelper local_60 [3];
  Message local_48;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  int target;
  state_ptr<int,_unsigned_long,_2UL> underTest;
  int testData;
  StatePointer_RegressionGitHubIssue4_Test *this_local;
  
  underTest.m_ptr_and_state._4_4_ = 1;
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<int,_unsigned_long,_2UL> *)&stack0xffffffffffffffe0,
             (pointer_type)((long)&underTest.m_ptr_and_state + 4),0);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*
                     ((state_ptr<int,_unsigned_long,_2UL> *)&stack0xffffffffffffffe0);
  gtest_ar.message_.ptr_._4_4_ = *piVar2;
  local_3c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_38,"target","1",(int *)((long)&gtest_ar.message_.ptr_ + 4),
             &local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(StatePointer, RegressionGitHubIssue4) {
	// Compile-time regression where apple-clang reported the following error:
	// 
	// [...]/state_ptr/include/putl/state_ptr.hpp:263:10: error: reinterpret_cast from rvalue to reference type
	//       'reference_type' (aka 'int &')
	//                 return reinterpret_cast<reference_type>(get_ptr());
	//                        ^~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
	// [...]/state_ptr/testsrc/state_ptr_tests.cpp:119:18: note: in instantiation of member function
	//       'putl::state_ptr<int, unsigned long, 2>::operator*' requested here
	//     int target = *underTest;
	int testData = 1;
	putl::state_ptr<int> underTest{&testData, 0};
	int target = *underTest;
	ASSERT_EQ(target, 1);
}